

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRule.c
# Opt level: O3

int Amap_CreateCheckEqual_rec(Kit_DsdNtk_t *p,int iLit0,int iLit1)

{
  ushort uVar1;
  ushort uVar2;
  Kit_DsdObj_t KVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Kit_DsdObj_t *pKVar7;
  ulong uVar8;
  Kit_DsdObj_t *pKVar9;
  
  if (-1 < iLit0) {
    if ((iLit0 & 1U) != 0) {
      __assert_fail("!Abc_LitIsCompl(iLit0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                    ,0x108,"int Amap_CreateCheckEqual_rec(Kit_DsdNtk_t *, int, int)");
    }
    if (-1 < iLit1) {
      if ((iLit1 & 1U) != 0) {
        __assert_fail("!Abc_LitIsCompl(iLit1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                      ,0x109,"int Amap_CreateCheckEqual_rec(Kit_DsdNtk_t *, int, int)");
      }
      uVar6 = (uint)iLit0 >> 1;
      uVar1 = p->nVars;
      uVar5 = (uint)p->nNodes + (uint)uVar1;
      if (uVar6 < uVar5) {
        if (uVar6 < uVar1) {
          pKVar9 = (Kit_DsdObj_t *)0x0;
        }
        else {
          pKVar9 = p->pNodes[(ulong)uVar6 - (ulong)uVar1];
        }
        uVar6 = (uint)iLit1 >> 1;
        if (uVar6 < uVar5) {
          if (uVar6 < uVar1) {
            pKVar7 = (Kit_DsdObj_t *)0x0;
          }
          else {
            pKVar7 = p->pNodes[(ulong)uVar6 - (ulong)uVar1];
          }
          if (pKVar9 != (Kit_DsdObj_t *)0x0 || pKVar7 != (Kit_DsdObj_t *)0x0) {
            if (pKVar9 == (Kit_DsdObj_t *)0x0) {
              return 0;
            }
            if (pKVar7 == (Kit_DsdObj_t *)0x0) {
              return 0;
            }
            KVar3 = *pKVar9;
            if (0x3ffffff < ((uint)*pKVar7 ^ (uint)KVar3)) {
              return 0;
            }
            uVar5 = (uint)KVar3 >> 6 & 7;
            if (uVar5 != ((uint)*pKVar7 >> 6 & 7)) {
              return 0;
            }
            if (1 < uVar5 - 3) {
              if (uVar5 == 5) {
                return 0;
              }
              __assert_fail("pObj0->Type == KIT_DSD_AND || pObj0->Type == KIT_DSD_XOR",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                            ,0x116,"int Amap_CreateCheckEqual_rec(Kit_DsdNtk_t *, int, int)");
            }
            if (0x3ffffff < (uint)KVar3) {
              uVar8 = 0;
              do {
                uVar1 = *(ushort *)((long)&pKVar9[1].field_0x0 + uVar8 * 2);
                uVar2 = *(ushort *)((long)&pKVar7[1].field_0x0 + uVar8 * 2);
                if (((uVar2 ^ uVar1) & 1) != 0) {
                  return 0;
                }
                iVar4 = Amap_CreateCheckEqual_rec(p,uVar1 & 0xfffffffe,uVar2 & 0xfffffffe);
                if (iVar4 == 0) {
                  return 0;
                }
                uVar8 = uVar8 + 1;
              } while (uVar8 < (uint)*pKVar9 >> 0x1a);
            }
          }
          return 1;
        }
      }
      __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kit.h"
                    ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
    }
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x130,"int Abc_LitIsCompl(int)");
}

Assistant:

int Amap_CreateCheckEqual_rec( Kit_DsdNtk_t * p, int iLit0, int iLit1 )
{
    Kit_DsdObj_t * pObj0, * pObj1; 
    int i;
    assert( !Abc_LitIsCompl(iLit0) );
    assert( !Abc_LitIsCompl(iLit1) );
    pObj0 = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit0) );
    pObj1 = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit1) );
    if ( pObj0 == NULL && pObj1 == NULL )
        return 1;
    if ( pObj0 == NULL || pObj1 == NULL )
        return 0;
    if ( pObj0->Type != pObj1->Type )
        return 0;
    if ( pObj0->nFans != pObj1->nFans )
        return 0;
    if ( pObj0->Type == KIT_DSD_PRIME )
        return 0;
    assert( pObj0->Type == KIT_DSD_AND || pObj0->Type == KIT_DSD_XOR );
    for ( i = 0; i < (int)pObj0->nFans; i++ )
    {
        if ( Abc_LitIsCompl(pObj0->pFans[i]) != Abc_LitIsCompl(pObj1->pFans[i]) )
            return 0;
        if ( !Amap_CreateCheckEqual_rec( p, Abc_LitRegular(pObj0->pFans[i]), Abc_LitRegular(pObj1->pFans[i]) ) )
            return 0;
    }
    return 1;
}